

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

RuntimeFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapFalseFunction(JavascriptLibrary *this)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  DynamicType *type;
  RuntimeFunction *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x194d,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) goto LAB_00c011b1;
    *puVar4 = 0;
  }
  addr = &this->asyncFromSyncIteratorValueUnwrapFalseFunction;
  if ((this->asyncFromSyncIteratorValueUnwrapFalseFunction).ptr == (RuntimeFunction *)0x0) {
    local_60 = (undefined1  [8])&FunctionInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1951;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    data._32_8_ = new<Memory::Recycler>(0x20,pRVar5,0x38bbb2);
    FunctionInfo::FunctionInfo
              ((FunctionInfo *)data._32_8_,
               JavascriptAsyncFromSyncIterator::EntryAsyncFromSyncIteratorValueUnwrapFalseFunction,
               None,0xffffffff,(FunctionProxy *)0x0);
    type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                            &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                             super_RecyclableObject,
                            JavascriptAsyncFromSyncIterator::
                            EntryAsyncFromSyncIteratorValueUnwrapFalseFunction,
                            (DynamicTypeHandler *)
                            &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                             ::defaultInstance,false,false);
    local_60 = (undefined1  [8])&RuntimeFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1954;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00c011b1;
      *puVar4 = 0;
    }
    this_00 = (RuntimeFunction *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar5,0x40);
    if (this_00 == (RuntimeFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00c011b1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    RuntimeFunction::RuntimeFunction(this_00,type,(FunctionInfo *)data._32_8_);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

RuntimeFunction* JavascriptLibrary::EnsureAsyncFromSyncIteratorValueUnwrapFalseFunction()
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());
        if (asyncFromSyncIteratorValueUnwrapFalseFunction == nullptr)
        {
            JavascriptMethod entryPoint = JavascriptAsyncFromSyncIterator::EntryAsyncFromSyncIteratorValueUnwrapFalseFunction;
            FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint);
            DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());

            asyncFromSyncIteratorValueUnwrapFalseFunction = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo);
        }

        return asyncFromSyncIteratorValueUnwrapFalseFunction;
    }